

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_DCP_DCData.cpp
# Opt level: O3

h__Reader * __thiscall
ASDCP::DCData::MXFReader::h__Reader::MD_to_DCData_DDesc
          (h__Reader *this,PrivateDCDataDescriptor *descriptor_object,DCDataDescriptor *DDesc)

{
  undefined8 uVar1;
  undefined8 *in_RCX;
  
  *in_RCX = *(undefined8 *)(DDesc[5].AssetID + 8);
  if (DDesc[5].DataEssenceCoding[8] == '\x01') {
    if (*(ulong *)DDesc[5].DataEssenceCoding >> 0x20 != 0) {
      __assert_fail("descriptor_object.ContainerDuration.const_get() <= 0xFFFFFFFFL",
                    "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/AS_DCP_DCData.cpp"
                    ,0x77,
                    "ASDCP::Result_t ASDCP::DCData::MXFReader::h__Reader::MD_to_DCData_DDesc(const MXF::PrivateDCDataDescriptor &, DCData::DCDataDescriptor &)"
                   );
    }
    *(int *)(in_RCX + 1) = (int)*(ulong *)DDesc[5].DataEssenceCoding;
  }
  uVar1 = *(undefined8 *)((long)&DDesc[8].EditRate.Numerator + 1);
  *(undefined8 *)((long)in_RCX + 0x1c) = *(undefined8 *)(DDesc[7].DataEssenceCoding + 9);
  *(undefined8 *)((long)in_RCX + 0x24) = uVar1;
  Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_OK);
  return this;
}

Assistant:

ASDCP::Result_t
ASDCP::DCData::MXFReader::h__Reader::MD_to_DCData_DDesc(const MXF::PrivateDCDataDescriptor& descriptor_object,
							DCData::DCDataDescriptor& DDesc)
{
  DDesc.EditRate = descriptor_object.SampleRate;
  if ( ! descriptor_object.ContainerDuration.empty() )
    {
      assert(descriptor_object.ContainerDuration.const_get() <= 0xFFFFFFFFL);
      DDesc.ContainerDuration = static_cast<ui32_t>(descriptor_object.ContainerDuration.const_get());
    }
  memcpy(DDesc.DataEssenceCoding, descriptor_object.DataEssenceCoding.Value(), SMPTE_UL_LENGTH);
  return RESULT_OK;
}